

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int64 __thiscall File::size(File *this)

{
  File *__offset;
  __off_t _Var1;
  off64_t size;
  off64_t currentPosition;
  File *this_local;
  
  __offset = (File *)lseek((int)this->fp,0,1);
  if ((long)__offset < 0) {
    this_local = (File *)0xffffffffffffffff;
  }
  else {
    this_local = (File *)lseek((int)this->fp,0,2);
    if ((long)this_local < 0) {
      this_local = (File *)0xffffffffffffffff;
    }
    else if ((__offset != this_local) &&
            (_Var1 = lseek((int)this->fp,(__off_t)__offset,0), _Var1 < 0)) {
      this_local = (File *)0xffffffffffffffff;
    }
  }
  return (int64)this_local;
}

Assistant:

int64 File::size()
{
#ifdef _WIN32
  LARGE_INTEGER fs;
  if(!GetFileSizeEx((HANDLE)fp, &fs))
    return -1;
  return fs.QuadPart;
#else
  // todo: use lstat?
  off64_t currentPosition = lseek((int)(intptr_t)fp, 0, SEEK_CUR);
  if(currentPosition < 0)
    return -1; 
  off64_t size = lseek((int)(intptr_t)fp, 0, SEEK_END);
  if(size < 0)
    return -1;
  if(currentPosition != size)
  {
    currentPosition = lseek((int)(intptr_t)fp, currentPosition, SEEK_SET);
    if(currentPosition < 0)
      return -1;
  }
  return size;
#endif
}